

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastMdR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase **ppTVar1;
  ParseContext *pPVar2;
  ZeroCopyInputStream *pZVar3;
  uint64_t uVar4;
  ParseContext *pPVar5;
  byte bVar6;
  bool bVar7;
  unsigned_short uVar8;
  uint16_t uVar9;
  uint32_t uVar10;
  int v1;
  int v2;
  uint uVar11;
  char *pcVar12;
  FieldAux *pFVar13;
  MessageLite *pMVar14;
  TcParseTableBase *this;
  TcParseTableBase *pTVar15;
  LogMessage *pLVar16;
  uint *puVar17;
  ulong uVar18;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_308;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_300;
  TcParseTableBase ***local_2f8;
  anon_class_24_3_e92acbd4 inner_loop;
  MessageLite *submsg;
  TcParseTableBase *inner_table;
  RepeatedPtrFieldBase *field;
  FieldAux aux;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2b8;
  unsigned_short expected_tag;
  uint64_t local_2b0;
  TcParseTableBase *local_2a8;
  ParseContext *local_2a0;
  ZeroCopyInputStream *local_298;
  MessageLite *local_290;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_288;
  TcFieldData local_280;
  TcFieldData local_278;
  undefined1 local_269;
  uint64_t uStack_268;
  bool always_return;
  TcParseTableBase *local_260;
  ParseContext *local_258;
  ZeroCopyInputStream *local_250;
  MessageLite *local_248;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_240;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_238;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_230;
  TcFieldData data_2;
  FastFieldEntry *fast_entry_1;
  size_t idx_1;
  unsigned_short coded_tag_1;
  uint32_t has_bits_offset_1;
  uint32_t has_bits_offset;
  LimitToken local_13c;
  LogMessage local_138;
  Voidify local_121;
  Nullable<const_char_*> local_120;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  undefined4 local_110;
  int old_depth;
  LimitToken local_fc;
  TcParseTableBase ****ppppTStack_f8;
  LimitToken old;
  ZeroCopyInputStream *local_e0;
  undefined1 local_c8 [12];
  int size;
  ZeroCopyInputStream *local_b8;
  ParseContext *local_b0;
  ZeroCopyInputStream *local_a8;
  ZeroCopyInputStream *local_a0;
  TcParseTableBase ****local_98;
  TcFieldData local_90;
  TcParseTableBase *local_88;
  ParseContext *local_80;
  ZeroCopyInputStream *local_78;
  MessageLite *local_70;
  ZeroCopyInputStream *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  local_2b0 = hasbits;
  local_2a8 = table;
  local_2a0 = ctx;
  local_298 = (ZeroCopyInputStream *)ptr;
  local_290 = msg;
  local_288 = data.field_0;
  uVar8 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)&local_288);
  pMVar14 = local_290;
  pZVar3 = local_298;
  pPVar2 = local_2a0;
  if (uVar8 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffd48);
    pcVar12 = MiniParse(pMVar14,(char *)pZVar3,pPVar2,(TcFieldData)aStack_2b8,local_2a8,local_2b0);
    return pcVar12;
  }
  aux.enum_range.last._2_2_ = UnalignedLoad<unsigned_short>((char *)local_298);
  pTVar15 = local_2a8;
  bVar6 = TcFieldData::aux_idx((TcFieldData *)&local_288);
  pFVar13 = TcParseTableBase::field_aux(pTVar15,(uint)bVar6);
  pMVar14 = local_290;
  field = (RepeatedPtrFieldBase *)pFVar13->table;
  uVar9 = TcFieldData::offset((TcFieldData *)&local_288);
  inner_table = (TcParseTableBase *)
                RefAt<google::protobuf::internal::RepeatedPtrFieldBase>(pMVar14,(ulong)uVar9);
  pMVar14 = TcParseTableBase::FieldAux::message_default((FieldAux *)&field);
  submsg = (MessageLite *)protobuf::MessageLite::GetTcParseTable(pMVar14);
  do {
    local_298 = (ZeroCopyInputStream *)((long)&local_298->_vptr_ZeroCopyInputStream + 2);
    inner_loop.inner_table =
         (TcParseTableBase **)
         AddMessage((TcParseTableBase *)submsg,(RepeatedPtrFieldBase *)inner_table);
    pZVar3 = local_298;
    pPVar2 = local_2a0;
    local_2f8 = &inner_loop.inner_table;
    inner_loop.submsg = (MessageLite **)&local_2a0;
    inner_loop.ctx = (ParseContext **)&submsg;
    ppppTStack_f8 = &local_2f8;
    EpsCopyInputStream::LimitToken::LimitToken(&local_fc);
    local_b0 = pPVar2;
    local_b8 = pZVar3;
    unique0x10000702 = &local_fc;
    local_c8._4_4_ = ReadSize((char **)&local_b8);
    if ((local_b8 == (ZeroCopyInputStream *)0x0) || (pPVar2->depth_ < 1)) {
      local_a8 = (ZeroCopyInputStream *)0x0;
    }
    else {
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_c8,(char *)pPVar2,(int)local_b8);
      EpsCopyInputStream::LimitToken::operator=(stack0xffffffffffffff40,(LimitToken *)local_c8);
      EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)local_c8);
      pPVar2->depth_ = pPVar2->depth_ + -1;
      local_a8 = local_b8;
    }
    if (local_a8 == (ZeroCopyInputStream *)0x0) {
      local_e0 = local_a8;
    }
    else {
      absl_log_internal_check_op_result._4_4_ = pPVar2->depth_;
      local_98 = ppppTStack_f8;
      local_a0 = local_a8;
      local_70 = (MessageLite *)**ppppTStack_f8;
      local_80 = (ParseContext *)*ppppTStack_f8[1];
      local_78 = local_a8;
      local_88 = (TcParseTableBase *)(*ppppTStack_f8[2] + 7);
      while (bVar7 = ParseContext::Done(local_80,(char **)&local_78), pMVar14 = local_70,
            pZVar3 = local_78, pPVar5 = local_80, ((bVar7 ^ 0xffU) & 1) != 0) {
        TcFieldData::TcFieldData(&local_90);
        pTVar15 = local_88;
        this = (TcParseTableBase *)((long)local_88 + -0x38);
        uVar8 = UnalignedLoad<unsigned_short>((char *)pZVar3);
        if (((long)(int)((uint)uVar8 & (uint)*(byte *)((long)pTVar15 + -0x30)) & 7U) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        data_1.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry
                       (this,(ulong)(long)(int)((uint)uVar8 & (uint)*(byte *)((long)pTVar15 + -0x30)
                                               ) >> 3);
        local_58.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
             (ulong)uVar8;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
        local_60.data = local_58.data;
        local_78 = (ZeroCopyInputStream *)
                   (*UNRECOVERED_JUMPTABLE)
                             (pMVar14,(char *)pZVar3,pPVar5,(TcFieldData)local_58,this,0);
        if ((local_78 == (ZeroCopyInputStream *)0x0) ||
           (uVar10 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar10 != 1))
        break;
      }
      pTVar15 = (TcParseTableBase *)((long)local_88 + -0x38);
      if ((undefined1  [56])((undefined1  [56])*local_88 & (undefined1  [56])0x100) ==
          (undefined1  [56])0x0) {
        local_88 = pTVar15;
        if (local_78 == (ZeroCopyInputStream *)0x0) {
          VerifyHasBitConsistency(local_70,pTVar15);
        }
        local_68 = local_78;
      }
      else {
        ppTVar1 = (TcParseTableBase **)((long)local_88 + -0x10);
        local_88 = pTVar15;
        local_68 = (ZeroCopyInputStream *)(*(code *)*ppTVar1)(local_70,local_78,local_80);
      }
      local_e0 = local_68;
      if (local_68 != (ZeroCopyInputStream *)0x0) {
        v1 = absl::lts_20250127::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result._4_4_);
        v2 = absl::lts_20250127::log_internal::GetReferenceableValue(pPVar2->depth_);
        local_120 = absl::lts_20250127::log_internal::Check_EQImpl(v1,v2,"old_depth == depth_");
        if (local_120 != (Nullable<const_char_*>)0x0) {
          pcVar12 = absl::lts_20250127::implicit_cast<char_const*>(local_120);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                     ,0x481,pcVar12);
          pLVar16 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_138);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_121,pLVar16);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_138);
        }
        local_120 = (Nullable<const_char_*>)0x0;
      }
      pPVar2->depth_ = pPVar2->depth_ + 1;
      EpsCopyInputStream::LimitToken::LimitToken(&local_13c,&local_fc);
      bVar7 = EpsCopyInputStream::PopLimit(&pPVar2->super_EpsCopyInputStream,&local_13c);
      EpsCopyInputStream::LimitToken::~LimitToken(&local_13c);
      if (((bVar7 ^ 0xffU) & 1) == 0) {
      }
      else {
        local_e0 = (ZeroCopyInputStream *)0x0;
      }
    }
    local_110 = 1;
    EpsCopyInputStream::LimitToken::~LimitToken(&local_fc);
    pMVar14 = local_290;
    pPVar2 = local_2a0;
    local_298 = local_e0;
    if (local_e0 == (ZeroCopyInputStream *)0x0) {
      TcFieldData::TcFieldData((TcFieldData *)&local_300);
      pcVar12 = Error(pMVar14,(char *)0x0,pPVar2,(TcFieldData)local_300,local_2a8,local_2b0);
      return pcVar12;
    }
    bVar7 = EpsCopyInputStream::DataAvailable(&local_2a0->super_EpsCopyInputStream,(char *)local_e0)
    ;
    pMVar14 = local_290;
    pZVar3 = local_298;
    if (((bVar7 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_308);
      if (local_2a8->has_bits_offset != 0) {
        uVar11 = (uint)local_2b0;
        puVar17 = RefAt<unsigned_int>(pMVar14,(ulong)(uint)local_2a8->has_bits_offset);
        *puVar17 = uVar11 | *puVar17;
      }
      return (char *)pZVar3;
    }
    uVar8 = UnalignedLoad<unsigned_short>((char *)local_298);
    local_248 = local_290;
    local_250 = local_298;
    local_258 = local_2a0;
    if (uVar8 != aux.enum_range.last._2_2_) {
      TcFieldData::TcFieldData(&data_local);
      local_240 = data_local.field_0;
      local_260 = local_2a8;
      uStack_268 = local_2b0;
      local_269 = 0;
      bVar7 = EpsCopyInputStream::DataAvailable
                        (&local_258->super_EpsCopyInputStream,(char *)local_250);
      pMVar14 = local_248;
      pZVar3 = local_250;
      pPVar2 = local_258;
      if (!bVar7) {
        TcFieldData::TcFieldData(&local_278);
        if (local_260->has_bits_offset != 0) {
          uVar11 = (uint)uStack_268;
          puVar17 = RefAt<unsigned_int>(pMVar14,(ulong)(uint)local_260->has_bits_offset);
          *puVar17 = uVar11 | *puVar17;
        }
        return (char *)pZVar3;
      }
      TcFieldData::TcFieldData(&local_280);
      pTVar15 = local_260;
      uVar4 = uStack_268;
      uVar8 = UnalignedLoad<unsigned_short>((char *)pZVar3);
      uVar18 = (ulong)(int)((uint)uVar8 & (uint)pTVar15->fast_idx_mask);
      if ((uVar18 & 7) == 0) {
        data_2.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry(pTVar15,uVar18 >> 3);
        local_230.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_2.field_0 + 8))->data ^
             (ulong)uVar8;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_2.field_0);
        local_238.data = local_230.data;
        pcVar12 = (*UNRECOVERED_JUMPTABLE)
                            (pMVar14,(char *)pZVar3,pPVar2,(TcFieldData)local_230,pTVar15,uVar4);
        return pcVar12;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMdR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, false, false>(
      PROTOBUF_TC_PARAM_PASS);
}